

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.h
# Opt level: O3

void __thiscall
flow::TerminateInstr::TerminateInstr
          (TerminateInstr *this,vector<flow::Value_*,_std::allocator<flow::Value_*>_> *ops)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40);
  Instr::Instr(&this->super_Instr,Void,ops,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)&PTR__Instr_0019d518;
  return;
}

Assistant:

TerminateInstr(const std::vector<Value*>& ops)
      : Instr(LiteralType::Void, ops, "") {}